

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

AssertionResult
testing::internal::EqFailure
          (char *lhs_expression,char *rhs_expression,string *lhs_value,string *rhs_value,
          bool ignoring_case)

{
  undefined1 uVar1;
  bool bVar2;
  AssertionResult *other;
  ulong uVar3;
  size_type sVar4;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  AssertionResult *in_RDI;
  byte in_R9B;
  AssertionResult AVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rhs_lines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lhs_lines;
  Message msg;
  size_t in_stack_000001c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000001d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000001d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff10;
  Message *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  AssertionResult *this;
  AssertionResult local_a8;
  string local_98 [16];
  string *in_stack_ffffffffffffff78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  Message local_38;
  byte local_29;
  
  local_29 = in_R9B & 1;
  this = in_RDI;
  Message::Message((Message *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  Message::operator<<((Message *)in_stack_ffffffffffffff00,(char (*) [35])in_stack_fffffffffffffef8)
  ;
  other = (AssertionResult *)
          Message::operator<<((Message *)in_stack_ffffffffffffff00,
                              (char (*) [4])in_stack_fffffffffffffef8);
  Message::operator<<((Message *)in_stack_ffffffffffffff00,(char **)in_stack_fffffffffffffef8);
  uVar1 = std::operator!=(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
  if ((bool)uVar1) {
    in_stack_ffffffffffffff28 =
         Message::operator<<((Message *)in_stack_ffffffffffffff00,
                             (char (*) [16])in_stack_fffffffffffffef8);
    Message::operator<<((Message *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
  Message::operator<<((Message *)in_stack_ffffffffffffff00,(char (*) [4])in_stack_fffffffffffffef8);
  Message::operator<<((Message *)in_stack_ffffffffffffff00,(char **)in_stack_fffffffffffffef8);
  bVar2 = std::operator!=(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
  if (bVar2) {
    in_stack_ffffffffffffff10 =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)Message::operator<<((Message *)in_stack_ffffffffffffff00,
                                (char (*) [16])in_stack_fffffffffffffef8);
    Message::operator<<((Message *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
  if ((local_29 & 1) != 0) {
    Message::operator<<((Message *)in_stack_ffffffffffffff00,
                        (char (*) [15])in_stack_fffffffffffffef8);
  }
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) && (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) {
    anon_unknown_91::SplitEscapedString(in_stack_ffffffffffffff78);
    anon_unknown_91::SplitEscapedString(in_stack_ffffffffffffff78);
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_60);
    if ((1 < sVar4) ||
       (sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&local_78), 1 < sVar4)) {
      Message::operator<<((Message *)in_stack_ffffffffffffff00,
                          (char (*) [13])in_stack_fffffffffffffef8);
      edit_distance::CreateUnifiedDiff(in_stack_000001d8,in_stack_000001d0,in_stack_000001c8);
      Message::operator<<((Message *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      std::__cxx11::string::~string(local_98);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_stack_ffffffffffffff10);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_stack_ffffffffffffff10);
  }
  AssertionFailure();
  AssertionResult::operator<<
            ((AssertionResult *)CONCAT17(uVar1,in_stack_ffffffffffffff30),in_stack_ffffffffffffff28)
  ;
  AssertionResult::AssertionResult(this,other);
  AssertionResult::~AssertionResult(&local_a8);
  Message::~Message(&local_38);
  AVar5.message_.ptr_ = extraout_RDX.ptr_;
  AVar5._0_8_ = in_RDI;
  return AVar5;
}

Assistant:

AssertionResult EqFailure(const char* lhs_expression,
                          const char* rhs_expression,
                          const std::string& lhs_value,
                          const std::string& rhs_value,
                          bool ignoring_case) {
  Message msg;
  msg << "Expected equality of these values:";
  msg << "\n  " << lhs_expression;
  if (lhs_value != lhs_expression) {
    msg << "\n    Which is: " << lhs_value;
  }
  msg << "\n  " << rhs_expression;
  if (rhs_value != rhs_expression) {
    msg << "\n    Which is: " << rhs_value;
  }

  if (ignoring_case) {
    msg << "\nIgnoring case";
  }

  if (!lhs_value.empty() && !rhs_value.empty()) {
    const std::vector<std::string> lhs_lines =
        SplitEscapedString(lhs_value);
    const std::vector<std::string> rhs_lines =
        SplitEscapedString(rhs_value);
    if (lhs_lines.size() > 1 || rhs_lines.size() > 1) {
      msg << "\nWith diff:\n"
          << edit_distance::CreateUnifiedDiff(lhs_lines, rhs_lines);
    }
  }

  return AssertionFailure() << msg;
}